

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O3

uint32_t __thiscall
cfd::ConfidentialTransactionContext::GetTxInIndex
          (ConfidentialTransactionContext *this,OutPoint *outpoint)

{
  uint32_t uVar1;
  Txid local_30;
  
  core::OutPoint::GetTxid(&local_30,outpoint);
  uVar1 = core::OutPoint::GetVout(outpoint);
  uVar1 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
            _vptr_AbstractTransaction[2])(this,&local_30,(ulong)uVar1);
  local_30._vptr_Txid = (_func_int **)&PTR__Txid_00723450;
  if (local_30.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return uVar1;
}

Assistant:

uint32_t ConfidentialTransactionContext::GetTxInIndex(
    const OutPoint& outpoint) const {
  return GetTxInIndex(outpoint.GetTxid(), outpoint.GetVout());
}